

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Normalizer.pb.cc
# Opt level: O0

bool CoreML::Specification::Normalizer_NormType_IsValid(int value)

{
  int value_local;
  
  return (uint)value < 3;
}

Assistant:

bool Normalizer_NormType_IsValid(int value) {
  switch (value) {
    case 0:
    case 1:
    case 2:
      return true;
    default:
      return false;
  }
}